

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
CartesianProductGenerator<libaom_test::CodecFactory_const*,libaom_test::TestMode,int,int,int,aom_rc_mode>
::IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul,3ul,4ul,5ul>>::AdvanceIfEnd<5ul>
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL,_4UL,_5UL>_> *this)

{
  bool bVar1;
  __tuple_element_t<5UL,_tuple<ParamIterator<const_CodecFactory_*>,_ParamIterator<TestMode>,_ParamIterator<int>,_ParamIterator<int>,_ParamIterator<int>,_ParamIterator<aom_rc_mode>_>_>
  *this_00;
  size_t NextI;
  bool last;
  ParamIterator<aom_rc_mode> *in_stack_ffffffffffffffc8;
  ParamIterator<aom_rc_mode> *in_stack_ffffffffffffffd0;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 uVar2;
  
  std::
  get<5ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<aom_rc_mode>>
            ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
              *)0x58879c);
  std::
  get<5ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<aom_rc_mode>>
            ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
              *)0x5887af);
  bVar1 = ParamIterator<aom_rc_mode>::operator!=
                    (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (!bVar1) {
    uVar2 = 0;
    this_00 = std::
              get<5ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<aom_rc_mode>>
                        ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
                          *)0x5887e9);
    std::
    get<5ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<aom_rc_mode>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
                *)0x5887fc);
    ParamIterator<aom_rc_mode>::operator=(this_00,in_stack_ffffffffffffffc8);
    std::
    get<4ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<aom_rc_mode>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<aom_rc_mode>_>
                *)0x588817);
    ParamIterator<int>::operator++((ParamIterator<int> *)this_00);
    AdvanceIfEnd<4ul>((IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL,_4UL,_5UL>_>
                       *)CONCAT17(uVar2,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

void AdvanceIfEnd() {
      if (std::get<ThisI>(current_) != std::get<ThisI>(end_)) return;

      bool last = ThisI == 0;
      if (last) {
        // We are done. Nothing else to propagate.
        return;
      }

      constexpr size_t NextI = ThisI - (ThisI != 0);
      std::get<ThisI>(current_) = std::get<ThisI>(begin_);
      ++std::get<NextI>(current_);
      AdvanceIfEnd<NextI>();
    }